

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

vector<YAML::Node,_std::allocator<YAML::Node>_> *
YAML::LoadAll(vector<YAML::Node,_std::allocator<YAML::Node>_> *__return_storage_ptr__,char *input)

{
  allocator local_1b1;
  string local_1b0 [32];
  stringstream stream;
  
  std::__cxx11::string::string(local_1b0,input,&local_1b1);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,local_1b0,_S_out|_S_in);
  std::__cxx11::string::~string(local_1b0);
  LoadAll(__return_storage_ptr__,(istream *)&stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> LoadAll(const char* input) {
  std::stringstream stream(input);
  return LoadAll(stream);
}